

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::clara::TextFlow::Column::iterator::operator*[abi_cxx11_(iterator *this)

{
  ulong uVar1;
  size_type sVar2;
  string *psVar3;
  undefined8 *in_RSI;
  string *in_RDI;
  string *in_stack_00000010;
  iterator *in_stack_00000018;
  string local_30 [48];
  
  uVar1 = in_RSI[1];
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)*in_RSI);
  if (sVar2 <= uVar1) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                  ,0x2184,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const")
    ;
  }
  if ((ulong)in_RSI[2] <= (ulong)in_RSI[4]) {
    psVar3 = line_abi_cxx11_((iterator *)0x34e53e);
    ::std::__cxx11::string::substr((ulong)local_30,(ulong)psVar3);
    addIndentAndSuffix(in_stack_00000018,in_stack_00000010);
    ::std::__cxx11::string::~string(local_30);
    return in_RDI;
  }
  __assert_fail("m_pos <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                ,0x2185,"std::string Catch::clara::TextFlow::Column::iterator::operator*() const");
}

Assistant:

auto operator *() const -> std::string {
			assert(m_stringIndex < m_column.m_strings.size());
			assert(m_pos <= m_end);
			return addIndentAndSuffix(line().substr(m_pos, m_len));
		}